

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O2

void __thiscall
DIS::ElectromagneticEmissionsPdu::~ElectromagneticEmissionsPdu(ElectromagneticEmissionsPdu *this)

{
  (this->super_DistributedEmissionsFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__ElectromagneticEmissionsPdu_001b0bd8;
  std::
  vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
  ::clear(&this->_systems);
  std::
  vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
  ::~vector(&this->_systems);
  EventID::~EventID(&this->_eventID);
  EntityID::~EntityID(&this->_emittingEntityID);
  DistributedEmissionsFamilyPdu::~DistributedEmissionsFamilyPdu
            (&this->super_DistributedEmissionsFamilyPdu);
  return;
}

Assistant:

ElectromagneticEmissionsPdu::~ElectromagneticEmissionsPdu()
{
    _systems.clear();
}